

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slaveinfo.c
# Opt level: O0

int si_PDOassign(uint16 slave,uint16 PDOassign,int mapoffset,int bitoffset)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  int abs_bit;
  int abs_offset;
  uint16 obj_idx;
  uint8 obj_subidx;
  uint8 bitlen;
  int32 rdat2;
  int rdl;
  int bsize;
  int wkc;
  uint16 local_1c;
  ushort uStack_1a;
  uint8 subcnt;
  uint16 subidx;
  uint16 idx;
  uint16 rdat;
  uint16 subidxloop;
  uint16 nidx;
  uint16 idxloop;
  int bitoffset_local;
  int mapoffset_local;
  uint16 PDOassign_local;
  uint16 slave_local;
  
  rdat2 = 0;
  _obj_idx = 2;
  local_1c = 0;
  _rdat = bitoffset;
  _nidx = mapoffset;
  bitoffset_local._0_2_ = PDOassign;
  bitoffset_local._2_2_ = slave;
  rdl = ec_SDOread(slave,PDOassign,0,0,&obj_idx,&local_1c,700000);
  if ((0 < rdl) && (local_1c != 0)) {
    subidx = local_1c;
    rdat2 = 0;
    for (idx = 1; idx <= subidx; idx = idx + 1) {
      _obj_idx = 2;
      local_1c = 0;
      rdl = ec_SDOread(bitoffset_local._2_2_,(uint16)bitoffset_local,(char)idx,0,&obj_idx,&local_1c,
                       700000);
      wkc._2_2_ = local_1c;
      if (local_1c != 0) {
        _obj_idx = 1;
        bsize._3_1_ = 0;
        rdl = ec_SDOread(bitoffset_local._2_2_,local_1c,0,0,&obj_idx,(long)&bsize + 3,700000);
        wkc._0_2_ = (ushort)bsize._3_1_;
        for (uStack_1a = 1; uStack_1a <= (ushort)wkc; uStack_1a = uStack_1a + 1) {
          _obj_idx = 4;
          abs_offset = 0;
          ec_SDOread(bitoffset_local._2_2_,wkc._2_2_,(char)uStack_1a,0,&obj_idx,&abs_offset,700000);
          iVar1 = abs_offset;
          bVar2 = (byte)abs_offset;
          rdat2 = (abs_offset & 0xffU) + rdat2;
          uVar4 = (ushort)((uint)abs_offset >> 0x10);
          bVar3 = (byte)((uint)abs_offset >> 8);
          uVar5 = _nidx + _rdat / 8;
          uVar7 = _rdat % 8;
          ODlist.Slave = bitoffset_local._2_2_;
          OElist.Entries = 0;
          rdl = 0;
          ODlist.Index[0] = uVar4;
          if ((uVar4 != 0) || (bVar3 != 0)) {
            rdl = ec_readOEsingle(0,bVar3,&ODlist,&OElist);
          }
          printf("  [0x%4.4X.%1d] 0x%4.4X:0x%2.2X 0x%2.2X",(ulong)uVar5,(ulong)uVar7,(ulong)uVar4,
                 (ulong)bVar3,(ulong)bVar2);
          if ((rdl < 1) || (OElist.Entries == 0)) {
            printf("\n");
          }
          else {
            pcVar6 = dtype2string(OElist.DataType[bVar3]);
            printf(" %-12s %s\n",pcVar6,(ulong)bVar3 * 0x29 + 0x113886);
          }
          _rdat = (iVar1 & 0xffU) + _rdat;
        }
      }
    }
  }
  return rdat2;
}

Assistant:

int si_PDOassign(uint16 slave, uint16 PDOassign, int mapoffset, int bitoffset)
{
    uint16 idxloop, nidx, subidxloop, rdat, idx, subidx;
    uint8 subcnt;
    int wkc, bsize = 0, rdl;
    int32 rdat2;
    uint8 bitlen, obj_subidx;
    uint16 obj_idx;
    int abs_offset, abs_bit;

    rdl = sizeof(rdat); rdat = 0;
    /* read PDO assign subindex 0 ( = number of PDO's) */
    wkc = ec_SDOread(slave, PDOassign, 0x00, FALSE, &rdl, &rdat, EC_TIMEOUTRXM);
    rdat = etohs(rdat);
    /* positive result from slave ? */
    if ((wkc > 0) && (rdat > 0))
    {
        /* number of available sub indexes */
        nidx = rdat;
        bsize = 0;
        /* read all PDO's */
        for (idxloop = 1; idxloop <= nidx; idxloop++)
        {
            rdl = sizeof(rdat); rdat = 0;
            /* read PDO assign */
            wkc = ec_SDOread(slave, PDOassign, (uint8)idxloop, FALSE, &rdl, &rdat, EC_TIMEOUTRXM);
            /* result is index of PDO */
            idx = etohl(rdat);
            if (idx > 0)
            {
                rdl = sizeof(subcnt); subcnt = 0;
                /* read number of subindexes of PDO */
                wkc = ec_SDOread(slave,idx, 0x00, FALSE, &rdl, &subcnt, EC_TIMEOUTRXM);
                subidx = subcnt;
                /* for each subindex */
                for (subidxloop = 1; subidxloop <= subidx; subidxloop++)
                {
                    rdl = sizeof(rdat2); rdat2 = 0;
                    /* read SDO that is mapped in PDO */
                    wkc = ec_SDOread(slave, idx, (uint8)subidxloop, FALSE, &rdl, &rdat2, EC_TIMEOUTRXM);
                    rdat2 = etohl(rdat2);
                    /* extract bitlength of SDO */
                    bitlen = LO_BYTE(rdat2);
                    bsize += bitlen;
                    obj_idx = (uint16)(rdat2 >> 16);
                    obj_subidx = (uint8)((rdat2 >> 8) & 0x000000ff);
                    abs_offset = mapoffset + (bitoffset / 8);
                    abs_bit = bitoffset % 8;
                    ODlist.Slave = slave;
                    ODlist.Index[0] = obj_idx;
                    OElist.Entries = 0;
                    wkc = 0;
                    /* read object entry from dictionary if not a filler (0x0000:0x00) */
                    if(obj_idx || obj_subidx)
                        wkc = ec_readOEsingle(0, obj_subidx, &ODlist, &OElist);
                    printf("  [0x%4.4X.%1d] 0x%4.4X:0x%2.2X 0x%2.2X", abs_offset, abs_bit, obj_idx, obj_subidx, bitlen);
                    if((wkc > 0) && OElist.Entries)
                    {
                        printf(" %-12s %s\n", dtype2string(OElist.DataType[obj_subidx]), OElist.Name[obj_subidx]);
                    }
                    else
                        printf("\n");
                    bitoffset += bitlen;
                };
            };
        };
    };
    /* return total found bitlength (PDO) */
    return bsize;
}